

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O1

int TIFFWriteDirectoryTagCheckedSlongArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,int32_t *value
              )

{
  int iVar1;
  
  if (count < 0x40000000) {
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabArrayOfLong((uint32_t *)value,(ulong)count);
    }
    iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,9,count,count * 4,value);
    return iVar1;
  }
  __assert_fail("count < 0x40000000",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                ,0x906,
                "int TIFFWriteDirectoryTagCheckedSlongArray(TIFF *, uint32_t *, TIFFDirEntry *, uint16_t, uint32_t, int32_t *)"
               );
}

Assistant:

static int TIFFWriteDirectoryTagCheckedSlongArray(TIFF *tif, uint32_t *ndir,
                                                  TIFFDirEntry *dir,
                                                  uint16_t tag, uint32_t count,
                                                  int32_t *value)
{
    assert(count < 0x40000000);
    assert(sizeof(int32_t) == 4);
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfLong((uint32_t *)value, count);
    return (TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_SLONG, count,
                                      count * 4, value));
}